

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

void nhdp_domain_init_link(nhdp_link *lnk)

{
  int iVar1;
  list_entity *plVar2;
  uint64_t uVar3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  int i;
  nhdp_link_domaindata *data;
  nhdp_domain *domain;
  nhdp_link *lnk_local;
  
  lnk->flooding_willingness = '\0';
  lnk->local_is_flooding_mpr = false;
  lnk->neigh_is_flooding_mpr = false;
  for (__tempptr._4_4_ = 0; plVar2 = _domain_list.next, __tempptr._4_4_ < 4;
      __tempptr._4_4_ = __tempptr._4_4_ + 1) {
    lnk->_domaindata[__tempptr._4_4_].metric.in = 0xffffff;
    lnk->_domaindata[__tempptr._4_4_].metric.out = 0xffffff;
    uVar3 = oonf_clock_getNow();
    lnk->_domaindata[__tempptr._4_4_].last_metric_change = uVar3;
  }
  for (; plVar2->prev != _domain_list.prev; plVar2 = plVar2->next) {
    iVar1 = *(int *)((long)&plVar2[-0x27].next + 4);
    if (((ulong)plVar2[-0x28].next[2].next & 1) != 0) {
      lnk->_domaindata[iVar1].metric.in = *(uint32_t *)&plVar2[-0x28].next[1].next;
      lnk->_domaindata[iVar1].metric.out = *(uint32_t *)((long)&plVar2[-0x28].next[1].next + 4);
    }
  }
  return;
}

Assistant:

void
nhdp_domain_init_link(struct nhdp_link *lnk) {
  struct nhdp_domain *domain;
  struct nhdp_link_domaindata *data;
  int i;

  /* initialize flooding MPR settings */
  lnk->flooding_willingness = RFC7181_WILLINGNESS_NEVER;
  lnk->local_is_flooding_mpr = false;
  lnk->neigh_is_flooding_mpr = false;

  /* initialize metrics */
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    lnk->_domaindata[i].metric.in = RFC7181_METRIC_INFINITE;
    lnk->_domaindata[i].metric.out = RFC7181_METRIC_INFINITE;
    lnk->_domaindata[i].last_metric_change = oonf_clock_getNow();
  }
  list_for_each_element(&_domain_list, domain, _node) {
    data = nhdp_domain_get_linkdata(domain, lnk);

    if (domain->metric->no_default_handling) {
      data->metric.in = domain->metric->incoming_link_start;
      data->metric.out = domain->metric->outgoing_link_start;
    }
  }
}